

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O1

REF_STATUS
ref_split_edge_ratio
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_BOOL RVar4;
  long lVar5;
  int iVar6;
  REF_DBL ratio;
  REF_INT nodes [27];
  double local_d8;
  REF_INT local_cc;
  REF_GRID local_c8;
  REF_NODE local_c0;
  ulong local_b8;
  REF_BOOL *local_b0;
  REF_INT local_a8 [30];
  
  local_c0 = ref_grid->node;
  *allowed = 0;
  lVar5 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar5 = 0x50;
  }
  ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar5 + -0x10);
  local_b8 = 0xffffffff;
  if (-1 < node0) {
    local_b8 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      local_b8 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  local_b0 = allowed;
  if ((int)local_b8 != -1) {
    local_cc = ref_cell->ref_adj->item[(int)local_b8].ref;
    local_c8 = ref_grid;
    do {
      if (0 < ref_cell->node_per) {
        iVar6 = 0;
        do {
          if (ref_cell->c2n[ref_cell->size_per * local_cc + iVar6] == node1) {
            uVar3 = ref_cell_nodes(ref_cell,local_cc,local_a8);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x28f,"ref_split_edge_ratio",(ulong)uVar3,"cell nodes");
              return uVar3;
            }
            if (0 < ref_cell->node_per) {
              lVar5 = 0;
              do {
                if (local_a8[lVar5] == node0) {
                  local_a8[lVar5] = new_node;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->node_per);
            }
            if (0 < ref_cell->edge_per) {
              lVar5 = 0;
              do {
                if ((local_a8[ref_cell->e2n[lVar5 * 2]] == new_node) ||
                   (local_a8[ref_cell->e2n[lVar5 * 2 + 1]] == new_node)) {
                  uVar3 = ref_node_ratio(local_c0,local_a8[ref_cell->e2n[lVar5 * 2]],
                                         local_a8[ref_cell->e2n[lVar5 * 2 + 1]],&local_d8);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x298,"ref_split_edge_ratio",(ulong)uVar3,"ratio node0");
                    return uVar3;
                  }
                  RVar4 = 0;
                  if ((local_d8 < local_c8->adapt->post_min_ratio) ||
                     (pRVar1 = &local_c8->adapt->post_max_ratio, RVar4 = 0,
                     *pRVar1 <= local_d8 && local_d8 != *pRVar1)) goto LAB_001f920b;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->edge_per);
            }
            if (0 < ref_cell->node_per) {
              lVar5 = 0;
              do {
                if (local_a8[lVar5] == new_node) {
                  local_a8[lVar5] = node0;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->node_per);
            }
            if (0 < ref_cell->node_per) {
              lVar5 = 0;
              do {
                if (local_a8[lVar5] == node1) {
                  local_a8[lVar5] = new_node;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->node_per);
            }
            if (0 < ref_cell->edge_per) {
              lVar5 = 0;
              do {
                if ((local_a8[ref_cell->e2n[lVar5 * 2]] == new_node) ||
                   (local_a8[ref_cell->e2n[lVar5 * 2 + 1]] == new_node)) {
                  uVar3 = ref_node_ratio(local_c0,local_a8[ref_cell->e2n[lVar5 * 2]],
                                         local_a8[ref_cell->e2n[lVar5 * 2 + 1]],&local_d8);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x2ac,"ref_split_edge_ratio",(ulong)uVar3,"ratio node0");
                    return uVar3;
                  }
                  RVar4 = 0;
                  if ((local_d8 < local_c8->adapt->post_min_ratio) ||
                     (pRVar1 = &local_c8->adapt->post_max_ratio,
                     *pRVar1 <= local_d8 && local_d8 != *pRVar1)) goto LAB_001f920b;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 < ref_cell->edge_per);
            }
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < ref_cell->node_per);
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar6 = pRVar2[(int)local_b8].next;
      local_b8 = (ulong)iVar6;
      if (local_b8 == 0xffffffffffffffff) {
        local_cc = -1;
      }
      else {
        local_cc = pRVar2[local_b8].ref;
      }
    } while (iVar6 != -1);
  }
  RVar4 = 1;
LAB_001f920b:
  *local_b0 = RVar4;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_INT new_node,
                                        REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_INT cell_edge, e0, e1;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}